

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::
write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<char,fmt::v6::basic_format_specs<char>>::dec_writer>
          (basic_writer<fmt::v6::buffer_range<char>_> *this,int num_digits,string_view prefix,
          format_specs specs,dec_writer f)

{
  type tVar1;
  size_t sVar2;
  format_specs *specs_00;
  char *pcVar3;
  int in_ESI;
  undefined8 in_R8;
  ulong in_R9;
  type unsiged_width;
  size_t padding;
  char_type fill;
  size_t size;
  undefined7 in_stack_ffffffffffffffc0;
  char cVar4;
  undefined4 in_stack_ffffffffffffffd0;
  int iStack_1c;
  undefined8 local_18;
  basic_string_view<char> local_10;
  
  local_18 = in_R9;
  sVar2 = basic_string_view<char>::size(&local_10);
  tVar1 = to_unsigned<int>(0);
  specs_00 = (format_specs *)(sVar2 + tVar1);
  pcVar3 = fill_t<char>::operator[]((fill_t<char> *)((long)&local_18 + 2),0);
  cVar4 = *pcVar3;
  if ((local_18._1_1_ & 0xf) == 4) {
    tVar1 = to_unsigned<int>(0);
    if (specs_00 < (format_specs *)(ulong)tVar1) {
      specs_00 = (format_specs *)(ulong)tVar1;
    }
  }
  else {
    iStack_1c = (int)((ulong)in_R8 >> 0x20);
    if (in_ESI < iStack_1c) {
      sVar2 = basic_string_view<char>::size(&local_10);
      tVar1 = to_unsigned<int>(0);
      specs_00 = (format_specs *)(sVar2 + tVar1);
      to_unsigned<int>(0);
      cVar4 = '0';
    }
  }
  if ((local_18 & 0xf00) == 0) {
    local_18 = local_18 & 0xfffffffffffff0ff | 0x200;
  }
  write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<char,fmt::v6::basic_format_specs<char>>::dec_writer>>
            ((basic_writer<fmt::v6::buffer_range<char>_> *)
             CONCAT44(in_ESI,in_stack_ffffffffffffffd0),specs_00,
             (padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>_>::int_writer<char,_fmt::v6::basic_format_specs<char>_>::dec_writer>
              *)CONCAT17(cVar4,in_stack_ffffffffffffffc0));
  return;
}

Assistant:

void write_int(int num_digits, string_view prefix, format_specs specs, F f) {
    std::size_t size = prefix.size() + to_unsigned(num_digits);
    char_type fill = specs.fill[0];
    std::size_t padding = 0;
    if (specs.align == align::numeric) {
      auto unsiged_width = to_unsigned(specs.width);
      if (unsiged_width > size) {
        padding = unsiged_width - size;
        size = unsiged_width;
      }
    } else if (specs.precision > num_digits) {
      size = prefix.size() + to_unsigned(specs.precision);
      padding = to_unsigned(specs.precision - num_digits);
      fill = static_cast<char_type>('0');
    }
    if (specs.align == align::none) specs.align = align::right;
    write_padded(specs, padded_int_writer<F>{size, prefix, fill, padding, f});
  }